

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_CCtx_refPrefix(ZSTD_CCtx *cctx,void *prefix,size_t prefixSize)

{
  size_t sVar1;
  
  sVar1 = ZSTD_CCtx_refPrefix_advanced(cctx,prefix,prefixSize,ZSTD_dct_rawContent);
  return sVar1;
}

Assistant:

size_t ZSTD_CCtx_refPrefix(ZSTD_CCtx* cctx, const void* prefix, size_t prefixSize)
{
    return ZSTD_CCtx_refPrefix_advanced(cctx, prefix, prefixSize, ZSTD_dct_rawContent);
}